

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O2

void Fxu_ListVarAddLiteral(Fxu_Var *pVar,Fxu_Lit *pLink)

{
  int *piVar1;
  Fxu_Lit *pFVar2;
  
  if ((pVar->lLits).pHead == (Fxu_Lit *)0x0) {
    (pVar->lLits).pHead = pLink;
    (pVar->lLits).pTail = pLink;
    pLink->pVNext = (Fxu_Lit *)0x0;
    pFVar2 = (Fxu_Lit *)0x0;
  }
  else {
    pLink->pVNext = (Fxu_Lit *)0x0;
    pFVar2 = (pVar->lLits).pTail;
    pFVar2->pVNext = pLink;
    (pVar->lLits).pTail = pLink;
  }
  pLink->pVPrev = pFVar2;
  piVar1 = &(pVar->lLits).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Fxu_ListVarAddLiteral( Fxu_Var * pVar, Fxu_Lit * pLink )
{
    Fxu_ListLit * pList = &(pVar->lLits);
    if ( pList->pHead == NULL )
    {
        pList->pHead = pLink;
        pList->pTail = pLink;
        pLink->pVPrev = NULL;
        pLink->pVNext = NULL;
    }
    else
    {
        pLink->pVNext = NULL;
        pList->pTail->pVNext = pLink;
        pLink->pVPrev = pList->pTail;
        pList->pTail = pLink;
    }
    pList->nItems++;
}